

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

bigint * __thiscall fmt::v7::detail::bigint::operator<<=(bigint *this,int shift)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  size_t sVar8;
  uint uVar9;
  
  if (-1 < shift) {
    this->exp_ = this->exp_ + ((uint)shift >> 5);
    uVar6 = shift & 0x1f;
    if ((uVar6 != 0) && (sVar4 = (this->bigits_).super_buffer<unsigned_int>.size_, sVar4 != 0)) {
      puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      sVar8 = 0;
      uVar5 = 0;
      do {
        uVar1 = puVar2[sVar8];
        uVar9 = (uVar1 << uVar6) + uVar5;
        uVar3 = 0x20 - uVar6 & 0x1f;
        uVar5 = uVar1 >> uVar3;
        puVar2[sVar8] = uVar9;
        sVar8 = sVar8 + 1;
      } while (sVar4 != sVar8);
      if (uVar1 >> uVar3 != 0) {
        uVar7 = sVar4 + 1;
        if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar7) {
          (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this);
          sVar4 = (this->bigits_).super_buffer<unsigned_int>.size_;
          uVar7 = sVar4 + 1;
        }
        puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
        (this->bigits_).super_buffer<unsigned_int>.size_ = uVar7;
        puVar2[sVar4] = uVar5;
      }
    }
    return this;
  }
  __assert_fail("shift >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                ,0x538,"bigint &fmt::detail::bigint::operator<<=(int)");
}

Assistant:

FMT_NOINLINE bigint& operator<<=(int shift) {
    assert(shift >= 0);
    exp_ += shift / bigit_bits;
    shift %= bigit_bits;
    if (shift == 0) return *this;
    bigit carry = 0;
    for (size_t i = 0, n = bigits_.size(); i < n; ++i) {
      bigit c = bigits_[i] >> (bigit_bits - shift);
      bigits_[i] = (bigits_[i] << shift) + carry;
      carry = c;
    }
    if (carry != 0) bigits_.push_back(carry);
    return *this;
  }